

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O3

Matrix33<float> * __thiscall
Imath_3_2::Matrix33<float>::gjInverse
          (Matrix33<float> *__return_storage_ptr__,Matrix33<float> *this,bool singExc)

{
  ulong uVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  invalid_argument *this_00;
  long lVar5;
  ulong uVar6;
  undefined8 *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined8 *puVar12;
  long lVar13;
  long lVar14;
  undefined8 *puVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  
  puVar4 = &local_58;
  local_58 = 0x3f800000;
  uStack_50 = 0;
  local_48 = 0x3f800000;
  uStack_40 = 0;
  local_38 = 1.0;
  lVar5 = (long)&uStack_80 + 4;
  local_88 = *(undefined8 *)this->x[0];
  uStack_80 = *(undefined8 *)(this->x[0] + 2);
  local_78 = *(undefined8 *)(this->x[1] + 1);
  uStack_70 = *(undefined8 *)this->x[2];
  local_68 = this->x[2][2];
  uVar10 = 1;
  lVar11 = 0x18;
  puVar12 = &local_88;
  lVar13 = (long)&uStack_50 + 4;
  uVar6 = 0;
  lVar14 = lVar5;
  do {
    uVar1 = uVar6 + 1;
    fVar23 = *(float *)(&local_88 + uVar6 * 2);
    fVar21 = -fVar23;
    if (-fVar23 <= fVar23) {
      fVar21 = fVar23;
    }
    uVar9 = uVar10 & 0xffffffff;
    lVar16 = 0;
    uVar8 = uVar6 & 0xffffffff;
    do {
      fVar23 = *(float *)(lVar14 + lVar16);
      fVar22 = -fVar23;
      if (-fVar23 <= fVar23) {
        fVar22 = fVar23;
      }
      uVar3 = uVar9;
      if (fVar22 <= fVar21) {
        fVar22 = fVar21;
        uVar3 = uVar8;
      }
      uVar8 = uVar3;
      lVar16 = lVar16 + 0xc;
      uVar9 = (ulong)((int)uVar9 + 1);
      fVar21 = fVar22;
    } while (lVar11 != lVar16);
    if ((fVar22 == 0.0) && (!NAN(fVar22))) {
      if (!singExc) goto LAB_00144030;
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
      goto LAB_0014408b;
    }
    uVar9 = uVar10;
    lVar16 = lVar13;
    lVar18 = lVar5;
    if (uVar6 != uVar8) {
      lVar19 = (long)(int)uVar8 * 0xc;
      lVar17 = 0;
      do {
        uVar2 = *(undefined4 *)((long)puVar12 + lVar17 * 4);
        *(undefined4 *)((long)puVar12 + lVar17 * 4) =
             *(undefined4 *)((long)&local_88 + lVar17 * 4 + lVar19);
        *(undefined4 *)((long)&local_88 + lVar17 * 4 + lVar19) = uVar2;
        uVar2 = *(undefined4 *)((long)puVar4 + lVar17 * 4);
        *(undefined4 *)((long)puVar4 + lVar17 * 4) =
             *(undefined4 *)((long)&local_58 + lVar17 * 4 + lVar19);
        *(undefined4 *)((long)&local_58 + lVar17 * 4 + lVar19) = uVar2;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
    }
    do {
      fVar23 = -*(float *)((long)&local_88 + uVar6 * 4 + uVar9 * 0xc) /
               *(float *)(&local_88 + uVar6 * 2);
      lVar19 = 0;
      do {
        fVar21 = *(float *)((long)puVar4 + lVar19);
        fVar22 = *(float *)(lVar16 + lVar19);
        *(float *)(lVar18 + lVar19) =
             *(float *)((long)puVar12 + lVar19) * fVar23 + *(float *)(lVar18 + lVar19);
        *(float *)(lVar16 + lVar19) = fVar21 * fVar23 + fVar22;
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0xc);
      bVar20 = uVar9 < 2;
      uVar9 = uVar9 + 1;
      lVar16 = lVar16 + 0xc;
      lVar18 = lVar18 + 0xc;
    } while (bVar20);
    uVar10 = uVar10 + 1;
    lVar14 = lVar14 + 0x10;
    lVar11 = lVar11 + -0xc;
    puVar12 = (undefined8 *)((long)puVar12 + 0xc);
    puVar4 = (undefined8 *)((long)puVar4 + 0xc);
    lVar5 = lVar5 + 0xc;
    lVar13 = lVar13 + 0xc;
    uVar6 = uVar1;
  } while (uVar1 != 2);
  if ((local_68 != 0.0) || (NAN(local_68))) {
    puVar4 = &uStack_70;
    puVar12 = &uStack_40;
    lVar5 = 2;
    fVar23 = local_68;
    do {
      lVar13 = 0;
      do {
        *(float *)((long)puVar4 + lVar13 * 4) = *(float *)((long)puVar4 + lVar13 * 4) / fVar23;
        *(float *)((long)puVar12 + lVar13 * 4) = *(float *)((long)puVar12 + lVar13 * 4) / fVar23;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      lVar13 = lVar5 + -1;
      if (lVar5 == 0) {
        *(undefined8 *)__return_storage_ptr__->x[0] = local_58;
        *(undefined8 *)(__return_storage_ptr__->x[0] + 2) = uStack_50;
        *(undefined8 *)(__return_storage_ptr__->x[1] + 1) = local_48;
        *(undefined8 *)__return_storage_ptr__->x[2] = uStack_40;
        goto LAB_0014403f;
      }
      lVar14 = 0;
      puVar7 = &local_88;
      puVar15 = &local_58;
      do {
        fVar23 = -*(float *)((long)&local_88 + lVar5 * 4 + lVar14 * 0xc);
        lVar11 = 0;
        do {
          fVar21 = *(float *)((long)puVar12 + lVar11);
          fVar22 = *(float *)((long)puVar15 + lVar11);
          *(float *)((long)puVar7 + lVar11) =
               *(float *)((long)puVar4 + lVar11) * fVar23 + *(float *)((long)puVar7 + lVar11);
          *(float *)((long)puVar15 + lVar11) = fVar21 * fVar23 + fVar22;
          lVar11 = lVar11 + 4;
        } while (lVar11 != 0xc);
        lVar14 = lVar14 + 1;
        puVar7 = (undefined8 *)((long)puVar7 + 0xc);
        puVar15 = (undefined8 *)((long)puVar15 + 0xc);
      } while (lVar14 != lVar5);
      fVar23 = *(float *)(&local_88 + lVar13 * 2);
      puVar4 = (undefined8 *)((long)puVar4 + -0xc);
      puVar12 = (undefined8 *)((long)puVar12 + -0xc);
      lVar5 = lVar13;
    } while ((fVar23 != 0.0) || (NAN(fVar23)));
  }
  if (singExc) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
LAB_0014408b:
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
LAB_00144030:
  *(float *)((long)(__return_storage_ptr__->x + 0) + 0) = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[0] + 2) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
  local_38 = 1.0;
LAB_0014403f:
  __return_storage_ptr__->x[2][2] = local_38;
  return __return_storage_ptr__;
}

Assistant:

inline Matrix33<T>
Matrix33<T>::gjInverse (bool singExc) const
{
    int      i, j, k;
    Matrix33 s;
    Matrix33 t (*this);

    // Forward elimination

    for (i = 0; i < 2; i++)
    {
        int pivot = i;

        T pivotsize = t.x[i][i];

        if (pivotsize < 0) pivotsize = -pivotsize;

        for (j = i + 1; j < 3; j++)
        {
            T tmp = t.x[j][i];

            if (tmp < 0) tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot     = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0)
        {
            if (singExc)
                throw std::invalid_argument ("Cannot invert singular matrix.");

            return Matrix33 ();
        }

        if (pivot != i)
        {
            for (j = 0; j < 3; j++)
            {
                T tmp;

                tmp           = t.x[i][j];
                t.x[i][j]     = t.x[pivot][j];
                t.x[pivot][j] = tmp;

                tmp           = s.x[i][j];
                s.x[i][j]     = s.x[pivot][j];
                s.x[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 3; j++)
        {
            T f = t.x[j][i] / t.x[i][i];

            for (k = 0; k < 3; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 2; i >= 0; --i)
    {
        T f;

        if ((f = t[i][i]) == 0)
        {
            if (singExc)
                throw std::invalid_argument ("Cannot invert singular matrix.");

            return Matrix33 ();
        }

        for (j = 0; j < 3; j++)
        {
            t.x[i][j] /= f;
            s.x[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t.x[j][i];

            for (k = 0; k < 3; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    return s;
}